

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O0

void unpack3(uint8_t *b,uint16_t *s)

{
  int i;
  uint16_t *s_local;
  uint8_t *b_local;
  
  *s = CONCAT11(*b,b[1]);
  if ((*s & 0x8000) == 0) {
    *s = *s ^ 0xffff;
  }
  else {
    *s = *s & 0x7fff;
  }
  for (i = 1; i < 0x10; i = i + 1) {
    s[i] = *s;
  }
  return;
}

Assistant:

static inline void
unpack3 (const uint8_t b[3], uint16_t s[16])
{
    s[0] = ((uint16_t) (b[0] << 8)) | ((uint16_t) b[1]);

    if (s[0] & 0x8000)
        s[0] &= 0x7fff;
    else
        s[0] = ~s[0];

    for (int i = 1; i < 16; ++i)
        s[i] = s[0];
}